

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptor::GetLocationPath
          (OneofDescriptor *this,vector<int,_std::allocator<int>_> *output)

{
  vector<int,_std::allocator<int>_> *this_00;
  Descriptor *this_01;
  int __c;
  char *pcVar1;
  value_type_conflict local_1c;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *output_local;
  OneofDescriptor *this_local;
  
  local_18 = output;
  output_local = (vector<int,_std::allocator<int>_> *)this;
  this_01 = containing_type(this);
  Descriptor::GetLocationPath(this_01,local_18);
  pcVar1 = "\b";
  std::vector<int,_std::allocator<int>_>::push_back
            (local_18,&DescriptorProto::kOneofDeclFieldNumber);
  this_00 = local_18;
  pcVar1 = index(this,pcVar1,__c);
  local_1c = (value_type_conflict)pcVar1;
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_1c);
  return;
}

Assistant:

void OneofDescriptor::GetLocationPath(std::vector<int>* output) const {
  containing_type()->GetLocationPath(output);
  output->push_back(DescriptorProto::kOneofDeclFieldNumber);
  output->push_back(index());
}